

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_formatter.cpp
# Opt level: O1

string * __thiscall
bidfx_public_api::price::subject::SubjectFormatter::FormatSubjectComponents
          (string *__return_storage_ptr__,SubjectFormatter *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *components)

{
  pointer pbVar1;
  long lVar2;
  string *psVar3;
  ostream *poVar4;
  ulong uVar5;
  undefined8 uVar6;
  long lVar7;
  NumericCharacterEntity entity;
  stringstream ss;
  string local_230;
  string local_210;
  string *local_1f0;
  _Rb_tree<char,_std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1e8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  if ((components->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (components->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    return __return_storage_ptr__;
  }
  std::
  _Rb_tree<char,_std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_1e8,
             (_Rb_tree<char,_std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)this);
  std::__cxx11::stringstream::stringstream(local_1b8);
  pbVar1 = (components->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((components->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == pbVar1) {
    uVar6 = 0;
    uVar5 = 0;
  }
  else {
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(pbVar1->_M_dataplus)._M_p,pbVar1->_M_string_length);
    local_230._M_dataplus._M_p._0_1_ = 0x3d;
    uVar6 = 1;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_230,1);
    pbVar1 = (components->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar5 = (long)(components->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5;
    if (1 < uVar5) {
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,pbVar1[1]._M_dataplus._M_p,pbVar1[1]._M_string_length);
      local_1f0 = __return_storage_ptr__;
      if (0x40 < (ulong)((long)(components->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(components->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start)) {
        uVar5 = 2;
        lVar7 = 0;
        do {
          local_230._M_dataplus._M_p._0_1_ = 0x2c;
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (local_1a8,(char *)&local_230,1);
          pbVar1 = (components->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(components->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <=
              uVar5) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar5);
          }
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar4,*(char **)((long)&pbVar1[2]._M_dataplus._M_p + lVar7),
                              *(long *)((long)&pbVar1[2]._M_string_length + lVar7));
          local_230._M_dataplus._M_p._0_1_ = 0x3d;
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_230,1);
          pbVar1 = (components->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(components->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <=
              uVar5 + 1) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
          }
          local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
          lVar2 = *(long *)((long)&pbVar1[3]._M_dataplus._M_p + lVar7);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_210,lVar2,
                     *(long *)((long)&pbVar1[3]._M_string_length + lVar7) + lVar2);
          NumericCharacterEntity::EncodeString
                    (&local_230,(NumericCharacterEntity *)&local_1e8,&local_210);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,(char *)CONCAT71(local_230._M_dataplus._M_p._1_7_,
                                             local_230._M_dataplus._M_p._0_1_),
                     local_230._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_230._M_dataplus._M_p._1_7_,local_230._M_dataplus._M_p._0_1_) !=
              &local_230.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_230._M_dataplus._M_p._1_7_,
                                     local_230._M_dataplus._M_p._0_1_),
                            local_230.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != &local_210.field_2) {
            operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
          }
          uVar5 = uVar5 + 2;
          lVar7 = lVar7 + 0x40;
        } while (uVar5 < (ulong)((long)(components->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(components->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      psVar3 = local_1f0;
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(local_138);
      std::
      _Rb_tree<char,_std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_1e8);
      return psVar3;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar6,uVar5
            );
}

Assistant:

std::string SubjectFormatter::FormatSubjectComponents(const std::vector<std::string>& components)
{
    if (components.empty())
    {
        return "";
    }

    NumericCharacterEntity entity = numeric_character_entity_;
    std::stringstream ss;

    ss << components.at(0) << KEY_VALUE_SEPARATOR << components.at(1);
    for (size_t i = 2; i < components.size(); i += 2)
    {
        ss << COMPONENT_SEPARATOR << components.at(i) << KEY_VALUE_SEPARATOR << entity.EncodeString(components.at(i + 1));
    }

    return ss.str();
}